

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O0

void helics::ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
               (basic_string_view<char,_std::char_traits<char>_> *val,SmallBuffer *store)

{
  string_view val_00;
  string_view val_01;
  SmallBuffer *in_RSI;
  undefined8 *in_RDI;
  SmallBuffer *in_stack_ffffffffffffffd0;
  byte *data;
  size_t sVar1;
  SmallBuffer *this;
  
  data = (byte *)*in_RDI;
  sVar1 = in_RDI[1];
  val_00._M_str = (char *)in_stack_ffffffffffffffd0;
  val_00._M_len = (size_t)in_RSI;
  this = in_RSI;
  helics::detail::getBinaryLength(val_00);
  SmallBuffer::resize(in_stack_ffffffffffffffd0,(size_t)in_RSI);
  SmallBuffer::data(this);
  val_01._M_str = (char *)this;
  val_01._M_len = sVar1;
  helics::detail::convertToBinary(data,val_01);
  return;
}

Assistant:

static void convert(const X& val, SmallBuffer& store)
    {
        store.resize(detail::getBinaryLength(val));
        detail::convertToBinary(store.data(), val);
    }